

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void embree::SceneGraph::set_time_range(Ref<embree::SceneGraph::Node> *node,BBox1f *time_range)

{
  Node *pNVar1;
  reference pvVar2;
  size_type sVar3;
  reference pvVar4;
  Ref<embree::SceneGraph::Node> *in_RSI;
  long *in_RDI;
  Ref<embree::SceneGraph::SubdivMeshNode> mesh_5;
  Ref<embree::SceneGraph::PointSetNode> mesh_4;
  Ref<embree::SceneGraph::HairSetNode> mesh_3;
  Ref<embree::SceneGraph::GridMeshNode> mesh_2;
  Ref<embree::SceneGraph::QuadMeshNode> mesh_1;
  Ref<embree::SceneGraph::TriangleMeshNode> mesh;
  size_t i_1;
  Ref<embree::SceneGraph::GroupNode> groupNode;
  size_t i;
  Ref<embree::SceneGraph::MultiTransformNode> xfmNode_1;
  Ref<embree::SceneGraph::TransformNode> xfmNode;
  long *local_538;
  long *local_508;
  long *local_4d8;
  long *local_4a8;
  long *local_478;
  long *local_448;
  long *local_3f8;
  long *local_3b8;
  BBox1f *local_388;
  ulong local_338;
  ulong local_328;
  Ref<embree::SceneGraph::Node> *pRVar5;
  
  if (*in_RDI == 0) {
    local_388 = (BBox1f *)0x0;
  }
  else {
    local_388 = (BBox1f *)__dynamic_cast(*in_RDI,&Node::typeinfo,&TransformNode::typeinfo,0);
  }
  if (local_388 != (BBox1f *)0x0) {
    (**(code **)((long)*local_388 + 0x10))();
  }
  if (local_388 == (BBox1f *)0x0) {
    if (*in_RDI == 0) {
      local_3b8 = (long *)0x0;
    }
    else {
      local_3b8 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
    }
    if (local_3b8 == (long *)0x0) {
      if (*in_RDI == 0) {
        local_3f8 = (long *)0x0;
      }
      else {
        local_3f8 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&GroupNode::typeinfo,0);
      }
      if (local_3f8 == (long *)0x0) {
        if (*in_RDI == 0) {
          local_448 = (long *)0x0;
        }
        else {
          local_448 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&TriangleMeshNode::typeinfo,0);
        }
        if (local_448 == (long *)0x0) {
          if (*in_RDI == 0) {
            local_478 = (long *)0x0;
          }
          else {
            local_478 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
          }
          if (local_478 == (long *)0x0) {
            if (*in_RDI == 0) {
              local_4a8 = (long *)0x0;
            }
            else {
              local_4a8 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&GridMeshNode::typeinfo,0);
            }
            if (local_4a8 == (long *)0x0) {
              if (*in_RDI == 0) {
                local_4d8 = (long *)0x0;
              }
              else {
                local_4d8 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&HairSetNode::typeinfo,0)
                ;
              }
              if (local_4d8 == (long *)0x0) {
                if (*in_RDI == 0) {
                  local_508 = (long *)0x0;
                }
                else {
                  local_508 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&PointSetNode::typeinfo
                                                     ,0);
                }
                if (local_508 == (long *)0x0) {
                  if (*in_RDI == 0) {
                    local_538 = (long *)0x0;
                  }
                  else {
                    local_538 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,
                                                       &SubdivMeshNode::typeinfo,0);
                  }
                  if (local_538 != (long *)0x0) {
                    (**(code **)(*local_538 + 0x10))();
                    *(undefined4 *)(local_538 + 0xd) = *(undefined4 *)&in_RSI->ptr;
                    *(undefined4 *)((long)local_538 + 0x6c) =
                         *(undefined4 *)((long)&in_RSI->ptr + 4);
                    (**(code **)(*local_538 + 0x18))();
                  }
                }
                else {
                  (**(code **)(*local_508 + 0x10))();
                  *(undefined4 *)(local_508 + 0xd) = *(undefined4 *)&in_RSI->ptr;
                  *(undefined4 *)((long)local_508 + 0x6c) = *(undefined4 *)((long)&in_RSI->ptr + 4);
                }
                if (local_508 != (long *)0x0) {
                  (**(code **)(*local_508 + 0x18))();
                }
              }
              else {
                (**(code **)(*local_4d8 + 0x10))();
                *(undefined4 *)(local_4d8 + 0xd) = *(undefined4 *)&in_RSI->ptr;
                *(undefined4 *)((long)local_4d8 + 0x6c) = *(undefined4 *)((long)&in_RSI->ptr + 4);
              }
              if (local_4d8 != (long *)0x0) {
                (**(code **)(*local_4d8 + 0x18))();
              }
            }
            else {
              (**(code **)(*local_4a8 + 0x10))();
              *(undefined4 *)(local_4a8 + 0xd) = *(undefined4 *)&in_RSI->ptr;
              *(undefined4 *)((long)local_4a8 + 0x6c) = *(undefined4 *)((long)&in_RSI->ptr + 4);
            }
            if (local_4a8 != (long *)0x0) {
              (**(code **)(*local_4a8 + 0x18))();
            }
          }
          else {
            (**(code **)(*local_478 + 0x10))();
            *(undefined4 *)(local_478 + 0xd) = *(undefined4 *)&in_RSI->ptr;
            *(undefined4 *)((long)local_478 + 0x6c) = *(undefined4 *)((long)&in_RSI->ptr + 4);
          }
          if (local_478 != (long *)0x0) {
            (**(code **)(*local_478 + 0x18))();
          }
        }
        else {
          (**(code **)(*local_448 + 0x10))();
          *(undefined4 *)(local_448 + 0xd) = *(undefined4 *)&in_RSI->ptr;
          *(undefined4 *)((long)local_448 + 0x6c) = *(undefined4 *)((long)&in_RSI->ptr + 4);
        }
        if (local_448 != (long *)0x0) {
          (**(code **)(*local_448 + 0x18))();
        }
      }
      else {
        (**(code **)(*local_3f8 + 0x10))();
        for (local_338 = 0;
            sVar3 = std::
                    vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                    ::size((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                            *)(local_3f8 + 0xd)), local_338 < sVar3; local_338 = local_338 + 1) {
          pvVar4 = std::
                   vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                   ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                 *)(local_3f8 + 0xd),local_338);
          pNVar1 = pvVar4->ptr;
          if (pNVar1 != (Node *)0x0) {
            (*(pNVar1->super_RefCount)._vptr_RefCount[2])();
          }
          set_time_range(in_RSI,local_388);
          if (pNVar1 != (Node *)0x0) {
            (*(pNVar1->super_RefCount)._vptr_RefCount[3])();
          }
        }
      }
      if (local_3f8 != (long *)0x0) {
        (**(code **)(*local_3f8 + 0x18))();
      }
    }
    else {
      (**(code **)(*local_3b8 + 0x10))();
      for (local_328 = 0;
          sVar3 = std::
                  vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                  ::size((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                          *)(local_3b8 + 0xd)), local_328 < sVar3; local_328 = local_328 + 1) {
        pRVar5 = in_RSI;
        pvVar2 = std::
                 vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                 ::operator[]((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                               *)(local_3b8 + 0xd),local_328);
        (pvVar2->time_range).lower = *(float *)&in_RSI->ptr;
        (pvVar2->time_range).upper = *(float *)((long)&in_RSI->ptr + 4);
        in_RSI = pRVar5;
      }
    }
    if (local_3b8 != (long *)0x0) {
      (**(code **)(*local_3b8 + 0x18))();
    }
  }
  else {
    local_388[0xd].lower = *(float *)&in_RSI->ptr;
    local_388[0xd].upper = *(float *)((long)&in_RSI->ptr + 4);
  }
  if (local_388 != (BBox1f *)0x0) {
    (**(code **)((long)*local_388 + 0x18))();
  }
  return;
}

Assistant:

void SceneGraph::set_time_range(Ref<SceneGraph::Node> node, const BBox1f& time_range)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      xfmNode->spaces.time_range = time_range;
    }
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      for (size_t i = 0; i < xfmNode->spaces.size(); ++i)
        xfmNode->spaces[i].time_range = time_range;
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        set_time_range(groupNode->children[i],time_range);
    }
    else if (Ref<SceneGraph::TriangleMeshNode> mesh = node.dynamicCast<SceneGraph::TriangleMeshNode>()) {
      mesh->time_range = time_range;
    }
    else if (Ref<SceneGraph::QuadMeshNode> mesh = node.dynamicCast<SceneGraph::QuadMeshNode>()) {
      mesh->time_range = time_range;
    }
    else if (Ref<SceneGraph::GridMeshNode> mesh = node.dynamicCast<SceneGraph::GridMeshNode>()) {
      mesh->time_range = time_range;
    }
    else if (Ref<SceneGraph::HairSetNode> mesh = node.dynamicCast<SceneGraph::HairSetNode>()) {
      mesh->time_range = time_range;
    }
    else if (Ref<SceneGraph::PointSetNode> mesh = node.dynamicCast<SceneGraph::PointSetNode>()) {
      mesh->time_range = time_range;
    }
    else if (Ref<SceneGraph::SubdivMeshNode> mesh = node.dynamicCast<SceneGraph::SubdivMeshNode>()) {
      mesh->time_range = time_range;
    }
  }